

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_update_all(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_b0;
  int local_ac [3];
  undefined4 local_a0;
  uint local_9c [3];
  ion_dictionary_t local_90;
  ion_dictionary_handler_t local_78;
  
  bhdct_setup(tc,&local_78,&local_90,ion_fill_edge_cases);
  uVar1 = 0;
  do {
    local_9c[1] = 0xfffffac7;
    local_9c[2] = uVar1;
    bhdct_update(tc,&local_90,local_9c + 2,local_9c + 1,'\0',1,'\x01');
    uVar1 = uVar1 + 1;
  } while (uVar1 != 10);
  uVar1 = 0x30;
  do {
    uVar1 = uVar1 + 2;
    local_a0 = 0xfffffac7;
    local_9c[0] = uVar1;
    bhdct_update(tc,&local_90,local_9c,&local_a0,'\0',1,'\x01');
  } while (uVar1 < 0x62);
  uVar1 = 0x1ef;
  do {
    uVar1 = uVar1 + 5;
    local_ac[1] = 0xfffffac7;
    local_ac[2] = uVar1;
    bhdct_update(tc,&local_90,local_ac + 2,local_ac + 1,'\0',1,'\x01');
  } while (uVar1 < 0x3e3);
  iVar2 = -0x66;
  do {
    iVar2 = iVar2 + 2;
    local_b0 = 0xfffffac7;
    local_ac[0] = iVar2;
    bhdct_update(tc,&local_90,local_ac,&local_b0,'\0',1,'\x01');
  } while (iVar2 < -0x34);
  bhdct_delete_dictionary(tc,&local_90);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_update_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}